

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

bool __thiscall
glcts::ProgramUniformCase::setAndCompareUniforms
          (ProgramUniformCase *this,GLuint pipeline,GLuint programA,GLuint programB,DataType dType,
          int seed)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  Functions *pFVar2;
  glGetUniformfvFunc *pp_Var3;
  int iVar4;
  GLint GVar5;
  uint uVar6;
  undefined4 extraout_var;
  long *plVar7;
  undefined8 *puVar8;
  Functions *pFVar9;
  TestError *pTVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  int *location;
  ulong uVar14;
  Functions *pFVar15;
  float *pfVar16;
  long lVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  GLuint activeProgram;
  string uniformBaseName;
  GLint locationA [12];
  uint udata [30];
  GLint locationB [12];
  ostringstream s;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  Functions *local_390;
  glGetUniformfvFunc *local_388;
  glGetUniformfvFunc *local_380;
  long *local_378;
  undefined8 local_370;
  long local_368;
  undefined8 uStack_360;
  GLuint local_358;
  uint local_354;
  long *local_350;
  long local_348;
  long local_340;
  long lStack_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  ulong local_310;
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  undefined4 *local_2e8;
  undefined8 local_2e0;
  undefined4 local_2d8;
  uint uStack_2d4;
  int local_2c8 [4];
  undefined1 local_2b8 [40];
  undefined8 local_290;
  float local_288 [32];
  long *local_208 [2];
  long local_1f8 [2];
  int local_1e8 [4];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [112];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_390 = (Functions *)CONCAT44(extraout_var,iVar4);
  local_2e8 = &local_2d8;
  local_2d8 = 0x6c615675;
  local_2e0 = 4;
  uStack_2d4 = uStack_2d4 & 0xffffff00;
  this_00 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  local_358 = pipeline;
  local_310 = (ulong)(uint)seed;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Begin:ProgramUniformCase iterate",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pFVar15 = local_390;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_140);
  lVar17 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::ostream::operator<<((ostringstream *)local_1b8,(int)lVar17);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    std::ios_base::~ios_base(local_148);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_2e8)
    ;
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_3a8 = *plVar11;
      lStack_3a0 = plVar7[3];
      local_3b8 = &local_3a8;
    }
    else {
      local_3a8 = *plVar11;
      local_3b8 = (long *)*plVar7;
    }
    local_3b0 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_378 != &local_368) {
      operator_delete(local_378,local_368 + 1);
    }
    GVar5 = (*pFVar15->getUniformLocation)(programA,(GLchar *)local_3b8);
    local_2c8[lVar17] = GVar5;
    GVar5 = (*pFVar15->getUniformLocation)(programB,(GLchar *)local_3b8);
    local_1e8[lVar17] = GVar5;
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,local_3a8 + 1);
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  local_388 = (glGetUniformfvFunc *)local_1d8;
  uVar13 = 0;
  local_380 = (glGetUniformfvFunc *)local_2b8;
  do {
    local_354 = (uint)uVar13 | 4;
    lVar17 = 0;
    iVar4 = 0;
    local_290 = uVar13;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::operator<<((ostringstream *)local_1b8,local_354);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_208,0,(char *)0x0,(ulong)local_2e8);
      local_350 = &local_340;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_340 = *plVar11;
        lStack_338 = plVar7[3];
      }
      else {
        local_340 = *plVar11;
        local_350 = (long *)*plVar7;
      }
      local_348 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_350);
      puVar12 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar12) {
        local_320 = *puVar12;
        lStack_318 = plVar7[3];
        local_330 = &local_320;
      }
      else {
        local_320 = *puVar12;
        local_330 = (ulong *)*plVar7;
      }
      local_328 = plVar7[1];
      *plVar7 = (long)puVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::operator<<((ostringstream *)local_1b8,iVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      uVar13 = 0xf;
      if (local_330 != &local_320) {
        uVar13 = local_320;
      }
      if (uVar13 < (ulong)(local_300 + local_328)) {
        uVar13 = 0xf;
        if (local_308 != local_2f8) {
          uVar13 = local_2f8[0];
        }
        if (uVar13 < (ulong)(local_300 + local_328)) goto LAB_00be2092;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_330);
      }
      else {
LAB_00be2092:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_308);
      }
      local_378 = &local_368;
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_368 = *plVar7;
        uStack_360 = puVar8[3];
      }
      else {
        local_368 = *plVar7;
        local_378 = (long *)*puVar8;
      }
      local_370 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)plVar7 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_378);
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_3a8 = *plVar11;
        lStack_3a0 = plVar7[3];
        local_3b8 = &local_3a8;
      }
      else {
        local_3a8 = *plVar11;
        local_3b8 = (long *)*plVar7;
      }
      local_3b0 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_378 != &local_368) {
        operator_delete(local_378,local_368 + 1);
      }
      if (local_308 != local_2f8) {
        operator_delete(local_308,local_2f8[0] + 1);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330,local_320 + 1);
      }
      if (local_350 != &local_340) {
        operator_delete(local_350,local_340 + 1);
      }
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      GVar5 = (*pFVar15->getUniformLocation)(programA,(GLchar *)local_3b8);
      *(GLint *)((long)local_380 + lVar17 * 4) = GVar5;
      GVar5 = (*pFVar15->getUniformLocation)(programB,(GLchar *)local_3b8);
      *(GLint *)((long)local_388 + lVar17 * 4) = GVar5;
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8,local_3a8 + 1);
      }
      lVar17 = lVar17 + 1;
      iVar4 = 1;
    } while ((int)lVar17 != 2);
    uVar6 = (int)local_290 + 1;
    uVar13 = (ulong)uVar6;
    local_388 = (glGetUniformfvFunc *)((long)local_388 + 8);
    local_380 = (glGetUniformfvFunc *)((long)local_380 + 8);
  } while (uVar6 != 4);
  lVar17 = 4;
  uVar13 = local_310;
  auVar20 = _DAT_019f34d0;
  if (dType == TYPE_FLOAT) {
    do {
      iVar4 = (int)uVar13;
      if (SUB164(auVar20 ^ _DAT_019ec5b0,4) == -0x80000000 &&
          SUB164(auVar20 ^ _DAT_019ec5b0,0) < -0x7fffffe2) {
        *(float *)((long)&local_290 + lVar17 + 4) = (float)iVar4;
        *(float *)((long)local_288 + lVar17) = (float)(iVar4 + 1);
      }
      auVar19._0_8_ = auVar20._0_8_ + 2;
      auVar19._8_8_ = auVar20._8_8_ + 2;
      lVar17 = lVar17 + 8;
      uVar13 = (ulong)(iVar4 + 2);
      auVar20 = auVar19;
    } while (lVar17 != 0x7c);
  }
  else {
    do {
      iVar4 = (int)uVar13;
      if (SUB164(auVar20 ^ _DAT_019ec5b0,4) == -0x80000000 &&
          SUB164(auVar20 ^ _DAT_019ec5b0,0) < -0x7fffffe2) {
        *(int *)((long)&local_290 + lVar17 + 4) = iVar4;
        *(int *)((long)local_288 + lVar17) = iVar4 + 1;
      }
      auVar21._0_8_ = auVar20._0_8_ + 2;
      auVar21._8_8_ = auVar20._8_8_ + 2;
      lVar17 = lVar17 + 8;
      uVar13 = (ulong)(iVar4 + 2);
      auVar20 = auVar21;
    } while (lVar17 != 0x7c);
  }
  if (dType == TYPE_INT) {
    progUniformi(this,pFVar15,programA,2,local_2c8,(int *)local_288);
  }
  else if (dType == TYPE_UINT) {
    progUniformui(this,pFVar15,programA,2,local_2c8,(uint *)local_288);
  }
  else if (dType == TYPE_FLOAT) {
    progUniformf(this,pFVar15,programA,2,local_2c8,local_288);
  }
  local_388 = &local_390->getUniformfv;
  local_380 = (glGetUniformfvFunc *)&local_390->getUniformuiv;
  local_390 = (Functions *)&local_390->getUniformiv;
  lVar17 = 0;
  pfVar16 = local_288;
  do {
    pp_Var3 = local_380;
    pFVar9 = (Functions *)local_388;
    pFVar2 = local_390;
    if (dType == TYPE_INT) {
      (**(glGetUniformfvFunc *)local_390)(programA,local_2c8[lVar17],(GLfloat *)local_1b8);
      pFVar9 = pFVar2;
LAB_00be2499:
      (**(glGetUniformfvFunc *)pFVar9)(programB,local_1e8[lVar17],(GLfloat *)&local_3b8);
    }
    else {
      if (dType == TYPE_UINT) {
        (**local_380)(programA,local_2c8[lVar17],(GLfloat *)local_1b8);
        pFVar9 = (Functions *)pp_Var3;
        goto LAB_00be2499;
      }
      if (dType == TYPE_FLOAT) {
        (**local_388)(programA,local_2c8[lVar17],(GLfloat *)local_1b8);
        goto LAB_00be2499;
      }
    }
    uVar13 = (ulong)(uint)(&DAT_01ae8f10)[lVar17];
    if ((int)(&DAT_01ae8f10)[lVar17] < 2) {
      uVar13 = 1;
    }
    uVar14 = 0;
    do {
      if ((*(float *)(local_1b8 + uVar14 * 4) != pfVar16[uVar14]) ||
         (*(float *)(local_1b8 + uVar14 * 4) == *(float *)((long)&local_3b8 + uVar14 * 4))) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"ProgramUniformi failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x5d7);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
    lVar17 = lVar17 + 1;
    pfVar16 = pfVar16 + uVar13;
  } while (lVar17 != 0xc);
  if (dType == TYPE_FLOAT) {
    fVar18 = local_288[0x1d] + 1.0;
    local_288[0] = fVar18;
    lVar17 = 1;
    do {
      fVar18 = fVar18 + 1.0;
      local_288[lVar17] = fVar18;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x1e);
  }
  else {
    local_288[0] = (float)((int)local_288[0x1d] + 1);
    iVar4 = (int)local_288[0x1d] + 2;
    lVar17 = 0;
    do {
      local_288[lVar17 + 1] = (float)(iVar4 + (int)lVar17);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x1d);
  }
  if (dType == TYPE_INT) {
    progUniformi(this,pFVar15,programB,2,local_1e8,(int *)local_288);
  }
  else if (dType == TYPE_UINT) {
    progUniformui(this,pFVar15,programB,2,local_1e8,(uint *)local_288);
  }
  else if (dType == TYPE_FLOAT) {
    progUniformf(this,pFVar15,programB,2,local_1e8,local_288);
  }
  lVar17 = 0;
  pfVar16 = local_288;
  do {
    pp_Var3 = local_380;
    pFVar9 = (Functions *)local_388;
    pFVar2 = local_390;
    if (dType == TYPE_INT) {
      (**(glGetUniformfvFunc *)local_390)(programA,local_2c8[lVar17],(GLfloat *)local_1b8);
      pFVar9 = pFVar2;
LAB_00be2670:
      (**(glGetUniformfvFunc *)pFVar9)(programB,local_1e8[lVar17],(GLfloat *)&local_3b8);
    }
    else {
      if (dType == TYPE_UINT) {
        (**local_380)(programA,local_2c8[lVar17],(GLfloat *)local_1b8);
        pFVar9 = (Functions *)pp_Var3;
        goto LAB_00be2670;
      }
      if (dType == TYPE_FLOAT) {
        (**local_388)(programA,local_2c8[lVar17],(GLfloat *)local_1b8);
        goto LAB_00be2670;
      }
    }
    uVar13 = (ulong)(uint)(&DAT_01ae8f10)[lVar17];
    if ((int)(&DAT_01ae8f10)[lVar17] < 2) {
      uVar13 = 1;
    }
    uVar14 = 0;
    do {
      fVar18 = *(float *)((long)&local_3b8 + uVar14 * 4);
      if ((fVar18 != pfVar16[uVar14]) || (*(float *)(local_1b8 + uVar14 * 4) == fVar18)) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"ProgramUniformi failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x619);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
    lVar17 = lVar17 + 1;
    pfVar16 = pfVar16 + uVar13;
    if (lVar17 == 0xc) {
      local_3b8 = (long *)((ulong)local_3b8 & 0xffffffff00000000);
      if (local_358 != 0) {
        (*pFVar15->getProgramPipelineiv)(local_358,0x8259,(GLint *)&local_3b8);
        if (((GLuint)local_3b8 != 0) &&
           ((GLuint)local_3b8 == programA || (GLuint)local_3b8 == programB)) {
          location = local_1e8;
          if ((GLuint)local_3b8 == programA) {
            location = local_2c8;
          }
          if (dType == TYPE_FLOAT) {
            fVar18 = local_288[0x1d] + 1.0;
            local_288[0] = fVar18;
            lVar17 = 1;
            do {
              fVar18 = fVar18 + 1.0;
              local_288[lVar17] = fVar18;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 0x1e);
          }
          else {
            local_288[0] = (float)((int)local_288[0x1d] + 1);
            lVar17 = 0;
            do {
              local_288[lVar17 + 1] = (float)((int)local_288[0x1d] + 2 + (int)lVar17);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 0x1d);
          }
          if (dType == TYPE_INT) {
            activeUniformi(this,pFVar15,2,location,(int *)local_288);
          }
          else if (dType == TYPE_UINT) {
            activeUniformui(this,pFVar15,2,location,(uint *)local_288);
          }
          else if (dType == TYPE_FLOAT) {
            activeUniformf(this,pFVar15,2,location,local_288);
          }
          pFVar15 = (Functions *)local_388;
          if (dType == TYPE_UINT) {
            pFVar15 = (Functions *)local_380;
          }
          if (dType == TYPE_INT) {
            pFVar15 = local_390;
          }
          lVar17 = 0;
          pfVar16 = local_288;
          do {
            if ((dType < TYPE_UINT_VEC2) && ((0x88000002U >> (dType & TYPE_UINT) & 1) != 0)) {
              (**(glGetUniformfvFunc *)pFVar15)
                        ((GLuint)local_3b8,location[lVar17],(GLfloat *)local_1b8);
            }
            uVar13 = (ulong)(uint)(&DAT_01ae8f10)[lVar17];
            if ((int)(&DAT_01ae8f10)[lVar17] < 2) {
              uVar13 = 1;
            }
            uVar14 = 0;
            do {
              if (*(float *)(local_1b8 + uVar14 * 4) != pfVar16[uVar14]) {
                pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar10,"ActiveShaderProgram failed",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                           ,0x663);
                __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
              uVar14 = uVar14 + 1;
            } while (uVar13 != uVar14);
            lVar17 = lVar17 + 1;
            pfVar16 = pfVar16 + uVar13;
          } while (lVar17 != 0xc);
        }
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,CONCAT44(uStack_2d4,local_2d8) + 1);
      }
      return true;
    }
  } while( true );
}

Assistant:

bool setAndCompareUniforms(glw::GLuint pipeline, glw::GLuint programA, glw::GLuint programB, glu::DataType dType,
							   int seed)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		// The fragment shader has defined uniforms of type:
		// scalar, vec2, vec3, vec4, and then length 2 arrays of
		// scalar, vec2, vec3, and vec4.
		// 4 uniforms in array form and 4 not in arrays.
		// We query a total of 12 uniform locations
		const int nonarrayUnifCount = 4;
		const int arrayUnifCount	= 4;
		const int arraySize			= 2;
		const int locationCount		= nonarrayUnifCount + arraySize * arrayUnifCount;
		// dwordCount represents the number of dwords to compare for each uniform location
		// scalar, vec2, vec3, vec4, scalar[0], scalar[1], vec2[0], vec2[1], etc.
		const int  dwordCount[locationCount] = { 1, 2, 3, 4, 1, 1, 2, 2, 3, 3, 4, 4 };
		glw::GLint locationA[locationCount];
		glw::GLint locationB[locationCount];
		// The total amount of data the uniforms take up: 1+2+3+4 + 2*(1+2+3+4)
		const int	udataCount = 30;
		unsigned int udata[udataCount]; //
		int*		 data  = (int*)&udata[0];
		float*		 fdata = (float*)&udata[0];
		int			 i, j, k;
		std::string  uniformBaseName("uVal");

		// ProgramUniform API verification
		log << TestLog::Message << "Begin:ProgramUniformCase iterate" << TestLog::EndMessage;

		// get uniform locations
		// scalar and vec uniforms
		for (i = 0; i < nonarrayUnifCount; i++)
		{
			string name  = uniformBaseName + de::toString(i);
			locationA[i] = gl.getUniformLocation(programA, name.c_str());
			locationB[i] = gl.getUniformLocation(programB, name.c_str());
		}
		// uniform arrays
		for (j = 0; j < arrayUnifCount; j++)
		{
			for (k = 0; k < arraySize; k++)
			{
				string name  = uniformBaseName + de::toString(nonarrayUnifCount + j) + "[" + de::toString(k) + "]";
				locationA[i] = gl.getUniformLocation(programA, name.c_str());
				locationB[i] = gl.getUniformLocation(programB, name.c_str());
				i++;
			}
		}

		// seed data buffer with unique values
		if (dType == glu::TYPE_FLOAT)
		{
			for (i = 0; i < udataCount; i++)
			{
				fdata[i] = (float)(seed + i);
			}
		}
		else
		{
			for (i = 0; i < udataCount; i++)
			{
				data[i] = seed + i;
			}
		}

		// set uniforms in program A
		if (dType == glu::TYPE_INT)
		{
			progUniformi(gl, programA, arraySize, locationA, data);
		}
		else if (dType == glu::TYPE_UINT)
		{
			progUniformui(gl, programA, arraySize, locationA, udata);
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			progUniformf(gl, programA, arraySize, locationA, fdata);
		}

		// get and compare uniforms
		unsigned int* uValue = &udata[0];
		for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
		{
			unsigned int retValA[4], retValB[4];

			if (dType == glu::TYPE_INT)
			{
				gl.getUniformiv(programA, locationA[i], (int*)&retValA[0]);
				gl.getUniformiv(programB, locationB[i], (int*)&retValB[0]);
			}
			else if (dType == glu::TYPE_UINT)
			{
				gl.getUniformuiv(programA, locationA[i], &retValA[0]);
				gl.getUniformuiv(programB, locationB[i], &retValB[0]);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				gl.getUniformfv(programA, locationA[i], (float*)&retValA[0]);
				gl.getUniformfv(programB, locationB[i], (float*)&retValB[0]);
			}

			for (j = 0; j < dwordCount[i]; j++)
			{
				// Compare programA uniform to expected value and
				// test to see if programB picked up the value.
				if ((retValA[j] != *uValue++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// reseed data buffer, continuing to increment
		if (dType == glu::TYPE_FLOAT)
		{
			fdata[0] = fdata[udataCount - 1] + 1.0f;
			for (i = 1; i < udataCount; i++)
			{
				fdata[i] = fdata[i - 1] + 1.0f;
			}
		}
		else
		{
			data[0] = data[udataCount - 1] + 1;
			for (i = 1; i < udataCount; i++)
			{
				data[i] = data[i - 1] + 1;
			}
		}

		// set uniforms in program B

		if (dType == glu::TYPE_INT)
		{
			progUniformi(gl, programB, arraySize, locationB, data);
		}
		else if (dType == glu::TYPE_UINT)
		{
			progUniformui(gl, programB, arraySize, locationB, udata);
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			progUniformf(gl, programB, arraySize, locationB, fdata);
		}

		// get and compare uniforms
		uValue = &udata[0];
		for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
		{
			unsigned int retValA[4], retValB[4];

			if (dType == glu::TYPE_INT)
			{
				gl.getUniformiv(programA, locationA[i], (int*)&retValA[0]);
				gl.getUniformiv(programB, locationB[i], (int*)&retValB[0]);
			}
			else if (dType == glu::TYPE_UINT)
			{
				gl.getUniformuiv(programA, locationA[i], &retValA[0]);
				gl.getUniformuiv(programB, locationB[i], &retValB[0]);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				gl.getUniformfv(programA, locationA[i], (float*)&retValA[0]);
				gl.getUniformfv(programB, locationB[i], (float*)&retValB[0]);
			}

			for (j = 0; j < dwordCount[i]; j++)
			{
				// Compare programB uniform to expected value and
				// test to see if programA picked up the value.
				if ((retValB[j] != *uValue++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// Test the conventional uniform interfaces on an ACTIVE_PROGRAM
		glw::GLuint activeProgram = 0;
		if (pipeline != 0)
		{
			gl.getProgramPipelineiv(pipeline, GL_ACTIVE_PROGRAM, (int*)&activeProgram);
		}
		if ((activeProgram != 0) && ((activeProgram == programA) || (activeProgram == programB)))
		{
			glw::GLint* location;

			location = (activeProgram == programA) ? locationA : locationB;

			// reseed data buffer, continuing to increment
			if (dType == glu::TYPE_FLOAT)
			{
				fdata[0] = fdata[udataCount - 1] + 1.0f;
				for (i = 1; i < udataCount; i++)
				{
					fdata[i] = fdata[i - 1] + 1.0f;
				}
			}
			else
			{
				data[0] = data[udataCount - 1] + 1;
				for (i = 1; i < udataCount; i++)
				{
					data[i] = data[i - 1] + 1;
				}
			}

			// set uniforms using original glUniform*

			if (dType == glu::TYPE_INT)
			{
				activeUniformi(gl, arraySize, location, data);
			}
			else if (dType == glu::TYPE_UINT)
			{
				activeUniformui(gl, arraySize, location, udata);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				activeUniformf(gl, arraySize, location, fdata);
			}

			// get and compare uniforms
			uValue = &udata[0];
			for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
			{
				unsigned int retVal[4];

				if (dType == glu::TYPE_INT)
				{
					gl.getUniformiv(activeProgram, location[i], (int*)&retVal[0]);
				}
				else if (dType == glu::TYPE_UINT)
				{
					gl.getUniformuiv(activeProgram, location[i], &retVal[0]);
				}
				else if (dType == glu::TYPE_FLOAT)
				{
					gl.getUniformfv(activeProgram, location[i], (float*)&retVal[0]);
				}

				for (j = 0; j < dwordCount[i]; j++)
				{
					// Compare activeProgram uniform to expected value
					if ((retVal[j] != *uValue++))
					{
						TCU_FAIL("ActiveShaderProgram failed");
					}
				}
			}
		}

		return true;
	}